

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

JavascriptString *
Js::JavascriptString::PadCore
          (ArgumentReader *args,JavascriptString *mainString,bool isPadStart,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint uVar4;
  undefined4 *puVar5;
  Var pvVar6;
  int64 iVar7;
  JavascriptString *pJVar8;
  JavascriptString *pstLeft;
  charcount_t length;
  
  if (mainString == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x85d,"(mainString != nullptr)","mainString != nullptr");
    if (!bVar2) goto LAB_00d27356;
    *puVar5 = 0;
  }
  if (((ulong)(args->super_Arguments).Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x85e,"(args.Info.Count > 0)","args.Info.Count > 0");
    if (!bVar2) goto LAB_00d27356;
    *puVar5 = 0;
  }
  if (((ulong)(args->super_Arguments).Info & 0xffffff) == 1) {
    return mainString;
  }
  pvVar6 = Arguments::operator[](&args->super_Arguments,1);
  iVar7 = JavascriptConversion::ToLength(pvVar6,scriptContext);
  uVar4 = mainString->m_charLength;
  if (iVar7 <= (long)(ulong)uVar4) {
    return mainString;
  }
  if ((*(uint *)&(args->super_Arguments).Info & 0xffffff) < 3) {
LAB_00d27205:
    pJVar8 = (JavascriptString *)0x0;
  }
  else {
    pvVar6 = Arguments::operator[](&args->super_Arguments,2);
    BVar3 = JavascriptOperators::IsUndefinedObject(pvVar6);
    if (BVar3 != 0) goto LAB_00d27205;
    pvVar6 = Arguments::operator[](&args->super_Arguments,2);
    pJVar8 = JavascriptConversion::ToString(pvVar6,scriptContext);
    if (pJVar8->m_charLength == 0) {
      return mainString;
    }
  }
  if (0x7ffffffe < iVar7) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5e9da,(PCWSTR)0x0);
  }
  if (pJVar8 == (JavascriptString *)0x0) {
    pJVar8 = CharStringCache::GetStringForChar
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                         charStringCache,L' ');
  }
  if (pJVar8->m_charLength == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x884,"(fillerString->GetLength() > 0)",
                                "fillerString->GetLength() > 0");
    if (!bVar2) {
LAB_00d27356:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  length = (int)iVar7 - uVar4;
  uVar4 = pJVar8->m_charLength;
  pstLeft = JavascriptLibrary::GetEmptyString
                      ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  if (uVar4 <= length) {
    uVar4 = length / uVar4;
    pstLeft = RepeatCore(pJVar8,uVar4,scriptContext);
    length = length - uVar4 * pJVar8->m_charLength;
  }
  if (length != 0) {
    pJVar8 = SubString::New(pJVar8,0,length);
    pstLeft = Concat(pstLeft,pJVar8);
  }
  pJVar8 = pstLeft;
  if (isPadStart) {
    pJVar8 = mainString;
    mainString = pstLeft;
  }
  pJVar8 = Concat(mainString,pJVar8);
  return pJVar8;
}

Assistant:

JavascriptString* JavascriptString::PadCore(ArgumentReader& args, JavascriptString *mainString, bool isPadStart, ScriptContext* scriptContext)
    {
        Assert(mainString != nullptr);
        Assert(args.Info.Count > 0);

        if (args.Info.Count == 1)
        {
            return mainString;
        }

        int64 maxLength = JavascriptConversion::ToLength(args[1], scriptContext);
        charcount_t currentLength = mainString->GetLength();
        if (maxLength <= currentLength)
        {
            return mainString;
        }

        JavascriptString * fillerString = nullptr;
        if (args.Info.Count > 2 && !JavascriptOperators::IsUndefinedObject(args[2]))
        {
            JavascriptString *argStr = JavascriptConversion::ToString(args[2], scriptContext);
            if (argStr->GetLength() > 0)
            {
                fillerString = argStr;
            }
            else
            {
                return mainString;
            }
        }

        if (maxLength > JavascriptString::MaxCharLength)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_OutOfBoundString);
        }

        if (fillerString == nullptr)
        {
            fillerString = NewWithBuffer(_u(" "), 1, scriptContext);
        }

        Assert(fillerString->GetLength() > 0);

        charcount_t fillLength = (charcount_t)(maxLength - currentLength);
        charcount_t count = fillLength / fillerString->GetLength();
        JavascriptString * finalPad = scriptContext->GetLibrary()->GetEmptyString();
        if (count > 0)
        {
            finalPad = RepeatCore(fillerString, count, scriptContext);
            fillLength -= (count * fillerString->GetLength());
        }

        if (fillLength > 0)
        {
            finalPad = Concat(finalPad, SubString::New(fillerString, 0, fillLength));
        }

        return isPadStart ? Concat(finalPad, mainString) : Concat(mainString, finalPad);
    }